

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::AcesInputFile::Data::initColorConversion(Data *this)

{
  undefined1 auVar1 [12];
  bool bVar2;
  Header *header;
  Chromaticities *pCVar3;
  V2f *pVVar4;
  Box2i *pBVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  V2f local_218;
  undefined8 local_1f8;
  Chromaticities local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  Chromaticities local_188;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  V2f local_a0;
  M44f local_98;
  M44f local_50;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  header = RgbaInputFile::header(this->rgbaFile);
  local_50.x[0][0] = 0.64;
  local_50.x[0][1] = 0.33;
  local_98.x[0][0] = 0.3;
  local_98.x[0][1] = 0.6;
  local_188.red.x = 0.15;
  local_188.red.y = 0.06;
  local_a0.x = 0.3127;
  local_a0.y = 0.329;
  Chromaticities::Chromaticities
            (&local_1d8,(V2f *)&local_50,(V2f *)&local_98,&local_188.red,&local_a0);
  bVar2 = hasChromaticities(header);
  if (bVar2) {
    pCVar3 = chromaticities(header);
    local_1d8.red = pCVar3->red;
    local_1d8.green = pCVar3->green;
    local_1d8.blue = pCVar3->blue;
    local_1d8.white = pCVar3->white;
  }
  local_218 = (V2f)((ulong)local_1d8.white & 0xffffffff);
  fVar6 = local_1d8.white.y;
  bVar2 = hasAdoptedNeutral(header);
  if (bVar2) {
    pVVar4 = adoptedNeutral(header);
    local_1d8.white = *pVVar4;
    fVar6 = local_1d8.white.y;
    local_218 = local_1d8.white;
  }
  acesChromaticities();
  fVar30 = acesChromaticities::acesChr.white.y;
  fVar12 = acesChromaticities::acesChr.white.x;
  local_188.red.y = acesChromaticities::acesChr.red.y;
  local_188.red.x = acesChromaticities::acesChr.red.x;
  local_188.green.x = acesChromaticities::acesChr.green.x;
  local_188.green.y = acesChromaticities::acesChr.green.y;
  local_188.blue.x = acesChromaticities::acesChr.blue.x;
  local_188.blue.y = acesChromaticities::acesChr.blue.y;
  local_188.white.x = acesChromaticities::acesChr.white.x;
  local_188.white.y = acesChromaticities::acesChr.white.y;
  auVar1._4_8_ = in_XMM3_Qa;
  auVar1._0_4_ = acesChromaticities::acesChr.blue.y;
  auVar10._0_8_ = auVar1._0_8_ << 0x20;
  auVar10._8_4_ = acesChromaticities::acesChr.white.x;
  auVar10._12_4_ = acesChromaticities::acesChr.white.y;
  if ((local_1d8.red.x == acesChromaticities::acesChr.red.x) &&
     (!NAN(local_1d8.red.x) && !NAN(acesChromaticities::acesChr.red.x))) {
    if ((local_1d8.red.y == acesChromaticities::acesChr.red.y) &&
       (!NAN(local_1d8.red.y) && !NAN(acesChromaticities::acesChr.red.y))) {
      if ((local_1d8.green.x == acesChromaticities::acesChr.green.x) &&
         (!NAN(local_1d8.green.x) && !NAN(acesChromaticities::acesChr.green.x))) {
        if ((local_1d8.green.y == acesChromaticities::acesChr.green.y) &&
           (!NAN(local_1d8.green.y) && !NAN(acesChromaticities::acesChr.green.y))) {
          if ((local_1d8.blue.x == acesChromaticities::acesChr.blue.x) &&
             (!NAN(local_1d8.blue.x) && !NAN(acesChromaticities::acesChr.blue.x))) {
            if ((local_1d8.blue.y == acesChromaticities::acesChr.blue.y) &&
               (!NAN(local_1d8.blue.y) && !NAN(acesChromaticities::acesChr.blue.y))) {
              if ((local_1d8.white.x == acesChromaticities::acesChr.white.x) &&
                 (!NAN(local_1d8.white.x) && !NAN(acesChromaticities::acesChr.white.x))) {
                if ((local_1d8.white.y == acesChromaticities::acesChr.white.y) &&
                   (!NAN(local_1d8.white.y) && !NAN(acesChromaticities::acesChr.white.y))) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  this->mustConvertColor = true;
  pBVar5 = Header::dataWindow(header);
  this->minX = (pBVar5->min).x;
  pBVar5 = Header::dataWindow(header);
  auVar16._12_4_ = (undefined4)((ulong)local_1f8 >> 0x20);
  auVar16._8_4_ = fVar30;
  auVar16._0_8_ = auVar10._8_8_;
  auVar15._8_8_ = auVar16._8_8_;
  auVar15._4_4_ = local_218.x;
  auVar15._0_4_ = fVar12;
  auVar17._0_12_ = auVar15._0_12_;
  auVar17._12_4_ = local_218.y;
  auVar18._4_4_ = fVar6;
  auVar18._0_4_ = fVar30;
  auVar18._8_4_ = fVar30;
  auVar18._12_4_ = fVar30;
  auVar18 = divps(auVar17,auVar18);
  auVar9._0_4_ = (1.0 - fVar12) - fVar30;
  auVar9._4_4_ = (1.0 - local_218.x) - fVar6;
  auVar9._8_4_ = (0.0 - fVar30) - fVar30;
  auVar9._12_4_ = (0.0 - local_218.y) - fVar30;
  auVar33._4_4_ = fVar6;
  auVar33._0_4_ = fVar30;
  auVar33._8_4_ = fVar30;
  auVar33._12_4_ = fVar30;
  auVar10 = divps(auVar9,auVar33);
  fVar20 = auVar18._0_4_;
  fVar23 = auVar18._4_4_;
  fVar26 = auVar18._8_4_;
  fVar8 = auVar18._12_4_;
  fVar6 = auVar10._0_4_;
  fVar12 = auVar10._4_4_;
  fVar30 = auVar10._8_4_;
  fVar7 = auVar10._12_4_;
  auVar19._0_4_ = fVar6 * 0.0 + fVar20 * 0.0 + 0.0 + 1.0;
  auVar19._4_4_ = fVar12 * 0.0 + fVar23 * 0.0 + 0.0 + 1.0;
  auVar19._8_4_ = fVar30 * 0.0 + fVar26 * 0.0 + 0.0 + 0.0;
  auVar19._12_4_ = fVar7 * 0.0 + fVar8 * 0.0 + 0.0 + 0.0;
  auVar32._0_4_ = fVar6 * 1.0296 + fVar20 * 0.0389 + -0.0685 + 0.0;
  auVar32._4_4_ = fVar12 * 1.0296 + fVar23 * 0.0389 + -0.0685 + 0.0;
  auVar32._8_4_ = fVar30 * 0.0 + fVar26 * 0.0 + 0.0 + 0.0;
  auVar32._12_4_ = fVar7 * 0.0 + fVar8 * 0.0 + 0.0 + 0.0;
  auVar14._0_4_ = fVar6 * -0.1614 + fVar20 * (float)0x3f652546 + 0.2664 + 0.0;
  auVar14._4_4_ = fVar12 * -0.1614 + fVar23 * (float)0x3f652546 + 0.2664 + 0.0;
  auVar14._8_4_ = fVar30 * 0.0 + fVar26 * 0.0 + 0.0 + 0.0;
  auVar14._12_4_ = fVar7 * 0.0 + fVar8 * 0.0 + 0.0 + 0.0;
  auVar18 = divps(auVar14,auVar19);
  auVar11._0_4_ = fVar6 * 0.0367 + fVar20 * -0.7502 + 1.7135 + 0.0;
  auVar11._4_4_ = fVar12 * 0.0367 + fVar23 * -0.7502 + 1.7135 + 0.0;
  auVar11._8_4_ = fVar30 * 0.0 + fVar26 * 0.0 + 0.0 + 0.0;
  auVar11._12_4_ = fVar7 * 0.0 + fVar8 * 0.0 + 0.0 + 0.0;
  auVar10 = divps(auVar11,auVar19);
  auVar33 = divps(auVar32,auVar19);
  fVar12 = auVar18._0_4_ / auVar18._4_4_;
  fVar6 = auVar10._0_4_ / auVar10._4_4_;
  local_198._4_12_ = auVar33._4_12_;
  fVar30 = auVar33._0_4_ / auVar33._4_4_;
  fVar23 = fVar12 * 0.8951 + 0.0;
  fVar26 = fVar6 * -0.7502 + 0.0;
  fVar20 = fVar30 * 0.0389 + 0.0 + 0.0;
  fVar24 = fVar12 * 0.2664 + 0.0 + 0.0;
  fVar27 = fVar6 * 1.7135 + 0.0;
  fVar21 = fVar30 * -0.0685 + 0.0 + 0.0;
  fVar25 = fVar12 * -0.1614 + 0.0 + 0.0;
  fVar28 = fVar6 * 0.0367 + 0.0;
  fVar22 = fVar30 * 1.0296 + 0.0 + 0.0;
  fVar13 = fVar12 * 0.0 + 0.0 + 0.0;
  fVar6 = fVar6 * 0.0 + 0.0;
  fVar31 = fVar30 * 0.0 + 0.0 + 0.0;
  fVar12 = fVar20 * 0.159963 + fVar23 * 0.986993 + fVar26 * -0.147054 + 0.0;
  fVar30 = fVar20 * 0.049291 + fVar23 * 0.432305 + fVar26 * 0.51836 + 0.0;
  fVar7 = fVar20 * 0.968487 + fVar23 * -0.008529 + fVar26 * 0.040043 + 0.0;
  fVar20 = fVar20 * 0.0 + fVar23 * 0.0 + fVar26 * 0.0 + 0.0;
  fVar23 = fVar21 * 0.159963 + fVar24 * 0.986993 + fVar27 * -0.147054 + 0.0;
  fVar26 = fVar21 * 0.049291 + fVar24 * 0.432305 + fVar27 * 0.51836 + 0.0;
  fVar8 = fVar21 * 0.968487 + fVar24 * -0.008529 + fVar27 * 0.040043 + 0.0;
  fVar21 = fVar21 * 0.0 + fVar24 * 0.0 + fVar27 * 0.0 + 0.0;
  fVar24 = fVar22 * 0.159963 + fVar25 * 0.986993 + fVar28 * -0.147054 + 0.0;
  fVar27 = fVar22 * 0.049291 + fVar25 * 0.432305 + fVar28 * 0.51836 + 0.0;
  fVar29 = fVar22 * 0.968487 + fVar25 * -0.008529 + fVar28 * 0.040043 + 0.0;
  fVar22 = fVar22 * 0.0 + fVar25 * 0.0 + fVar28 * 0.0 + 0.0;
  fVar25 = fVar31 * 0.159963 + fVar13 * 0.986993 + fVar6 * -0.147054 + 0.0;
  local_1b8 = ZEXT416((uint)(fVar31 * 0.049291 + fVar13 * 0.432305 + fVar6 * 0.51836 + 0.0));
  local_1a8 = ZEXT416((uint)(fVar31 * 0.968487 + fVar13 * -0.008529 + fVar6 * 0.040043 + 0.0));
  this->maxX = (pBVar5->max).x;
  local_198._0_4_ = fVar31 * 0.0 + fVar13 * 0.0 + fVar6 * 0.0 + 1.0;
  RGBtoXYZ(&local_50,&local_1d8,1.0);
  local_b8 = ZEXT416((uint)(local_50.x[0][3] * fVar25 +
                           local_50.x[0][2] * fVar24 +
                           local_50.x[0][0] * fVar12 + fVar23 * local_50.x[0][1]));
  local_d8 = ZEXT416((uint)(local_50.x[0][3] * (float)local_1b8._0_4_ +
                           local_50.x[0][2] * fVar27 +
                           local_50.x[0][0] * fVar30 + fVar26 * local_50.x[0][1]));
  local_c8 = ZEXT416((uint)(local_50.x[0][3] * (float)local_1a8._0_4_ +
                           local_50.x[0][2] * fVar29 +
                           local_50.x[0][0] * fVar7 + fVar8 * local_50.x[0][1]));
  local_e8 = ZEXT416((uint)(local_50.x[0][3] * (float)local_198._0_4_ +
                           local_50.x[0][2] * fVar22 +
                           local_50.x[0][0] * fVar20 + local_50.x[0][1] * fVar21));
  local_f8 = ZEXT416((uint)(local_50.x[1][3] * fVar25 +
                           local_50.x[1][2] * fVar24 +
                           local_50.x[1][0] * fVar12 + fVar23 * local_50.x[1][1]));
  local_108 = ZEXT416((uint)(local_50.x[1][3] * (float)local_1b8._0_4_ +
                            local_50.x[1][2] * fVar27 +
                            local_50.x[1][0] * fVar30 + fVar26 * local_50.x[1][1]));
  local_118 = ZEXT416((uint)(local_50.x[1][3] * (float)local_1a8._0_4_ +
                            local_50.x[1][2] * fVar29 +
                            local_50.x[1][0] * fVar7 + fVar8 * local_50.x[1][1]));
  local_128 = ZEXT416((uint)(local_50.x[1][3] * (float)local_198._0_4_ +
                            local_50.x[1][2] * fVar22 +
                            local_50.x[1][0] * fVar20 + local_50.x[1][1] * fVar21));
  local_138 = ZEXT416((uint)(local_50.x[2][3] * fVar25 +
                            local_50.x[2][2] * fVar24 +
                            local_50.x[2][0] * fVar12 + fVar23 * local_50.x[2][1]));
  local_148 = ZEXT416((uint)(local_50.x[2][3] * (float)local_1b8._0_4_ +
                            local_50.x[2][2] * fVar27 +
                            local_50.x[2][0] * fVar30 + fVar26 * local_50.x[2][1]));
  local_158 = ZEXT416((uint)(local_50.x[2][3] * (float)local_1a8._0_4_ +
                            local_50.x[2][2] * fVar29 +
                            local_50.x[2][0] * fVar7 + fVar8 * local_50.x[2][1]));
  local_168 = ZEXT416((uint)(local_50.x[2][3] * (float)local_198._0_4_ +
                            local_50.x[2][2] * fVar22 +
                            local_50.x[2][0] * fVar20 + local_50.x[2][1] * fVar21));
  fVar6 = fVar25 * local_50.x[3][3] +
          fVar24 * local_50.x[3][2] + fVar12 * local_50.x[3][0] + fVar23 * local_50.x[3][1];
  local_1b8._0_4_ =
       (float)local_1b8._0_4_ * local_50.x[3][3] +
       fVar27 * local_50.x[3][2] + fVar30 * local_50.x[3][0] + fVar26 * local_50.x[3][1];
  local_1a8._0_4_ =
       (float)local_1a8._0_4_ * local_50.x[3][3] +
       fVar29 * local_50.x[3][2] + fVar7 * local_50.x[3][0] + fVar8 * local_50.x[3][1];
  local_198._0_4_ =
       (float)local_198._0_4_ * local_50.x[3][3] +
       fVar22 * local_50.x[3][2] + fVar20 * local_50.x[3][0] + fVar21 * local_50.x[3][1];
  XYZtoRGB(&local_98,&local_188,1.0);
  (this->fileToAces).x[0][0] =
       (float)local_e8._0_4_ * local_98.x[3][0] +
       (float)local_c8._0_4_ * local_98.x[2][0] +
       (float)local_b8._0_4_ * local_98.x[0][0] + (float)local_d8._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[0][1] =
       (float)local_e8._0_4_ * local_98.x[3][1] +
       (float)local_c8._0_4_ * local_98.x[2][1] +
       (float)local_b8._0_4_ * local_98.x[0][1] + (float)local_d8._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[0][2] =
       (float)local_e8._0_4_ * local_98.x[3][2] +
       (float)local_c8._0_4_ * local_98.x[2][2] +
       (float)local_b8._0_4_ * local_98.x[0][2] + (float)local_d8._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[0][3] =
       (float)local_e8._0_4_ * local_98.x[3][3] +
       (float)local_c8._0_4_ * local_98.x[2][3] +
       (float)local_b8._0_4_ * local_98.x[0][3] + (float)local_d8._0_4_ * local_98.x[1][3];
  (this->fileToAces).x[1][0] =
       (float)local_128._0_4_ * local_98.x[3][0] +
       (float)local_118._0_4_ * local_98.x[2][0] +
       (float)local_f8._0_4_ * local_98.x[0][0] + (float)local_108._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[1][1] =
       (float)local_128._0_4_ * local_98.x[3][1] +
       (float)local_118._0_4_ * local_98.x[2][1] +
       (float)local_f8._0_4_ * local_98.x[0][1] + (float)local_108._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[1][2] =
       (float)local_128._0_4_ * local_98.x[3][2] +
       (float)local_118._0_4_ * local_98.x[2][2] +
       (float)local_f8._0_4_ * local_98.x[0][2] + (float)local_108._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[1][3] =
       (float)local_128._0_4_ * local_98.x[3][3] +
       (float)local_118._0_4_ * local_98.x[2][3] +
       (float)local_f8._0_4_ * local_98.x[0][3] + (float)local_108._0_4_ * local_98.x[1][3];
  (this->fileToAces).x[2][0] =
       (float)local_168._0_4_ * local_98.x[3][0] +
       (float)local_158._0_4_ * local_98.x[2][0] +
       (float)local_138._0_4_ * local_98.x[0][0] + (float)local_148._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[2][1] =
       (float)local_168._0_4_ * local_98.x[3][1] +
       (float)local_158._0_4_ * local_98.x[2][1] +
       (float)local_138._0_4_ * local_98.x[0][1] + (float)local_148._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[2][2] =
       (float)local_168._0_4_ * local_98.x[3][2] +
       (float)local_158._0_4_ * local_98.x[2][2] +
       (float)local_138._0_4_ * local_98.x[0][2] + (float)local_148._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[2][3] =
       (float)local_168._0_4_ * local_98.x[3][3] +
       (float)local_158._0_4_ * local_98.x[2][3] +
       (float)local_138._0_4_ * local_98.x[0][3] + (float)local_148._0_4_ * local_98.x[1][3];
  (this->fileToAces).x[3][0] =
       (float)local_198._0_4_ * local_98.x[3][0] +
       (float)local_1a8._0_4_ * local_98.x[2][0] +
       fVar6 * local_98.x[0][0] + (float)local_1b8._0_4_ * local_98.x[1][0];
  (this->fileToAces).x[3][1] =
       (float)local_198._0_4_ * local_98.x[3][1] +
       (float)local_1a8._0_4_ * local_98.x[2][1] +
       fVar6 * local_98.x[0][1] + (float)local_1b8._0_4_ * local_98.x[1][1];
  (this->fileToAces).x[3][2] =
       (float)local_198._0_4_ * local_98.x[3][2] +
       (float)local_1a8._0_4_ * local_98.x[2][2] +
       fVar6 * local_98.x[0][2] + (float)local_1b8._0_4_ * local_98.x[1][2];
  (this->fileToAces).x[3][3] =
       (float)local_198._0_4_ * local_98.x[3][3] +
       (float)local_1a8._0_4_ * local_98.x[2][3] +
       fVar6 * local_98.x[0][3] + (float)local_1b8._0_4_ * local_98.x[1][3];
  return;
}

Assistant:

void
AcesInputFile::Data::initColorConversion ()
{
    const Header& header = rgbaFile->header ();

    Chromaticities fileChr;

    if (hasChromaticities (header)) fileChr = chromaticities (header);

    V2f fileNeutral = fileChr.white;

    if (hasAdoptedNeutral (header))
    {
        fileNeutral   = adoptedNeutral (header);
        fileChr.white = fileNeutral; // for RGBtoXYZ() purposes.
    }

    const Chromaticities acesChr = acesChromaticities ();

    V2f acesNeutral = acesChr.white;

    if (fileChr.red == acesChr.red && fileChr.green == acesChr.green &&
        fileChr.blue == acesChr.blue && fileChr.white == acesChr.white)
    {
        //
        // The file already contains ACES data,
        // color conversion is not necessary.

        return;
    }

    mustConvertColor = true;
    minX             = header.dataWindow ().min.x;
    maxX             = header.dataWindow ().max.x;

    //
    // Create a matrix that transforms colors from the
    // RGB space of the input file into the ACES space
    // using a color adaptation transform to move the
    // white point.
    //

    //
    // We'll need the Bradford cone primary matrix and its inverse
    //

    static const M44f bradfordCPM (
        0.895100f,
        -0.750200f,
        0.038900f,
        0.000000f,
        0.266400f,
        1.713500f,
        -0.068500f,
        0.000000f,
        -0.161400f,
        0.036700f,
        1.029600f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    const static M44f inverseBradfordCPM (
        0.986993f,
        0.432305f,
        -0.008529f,
        0.000000f,
        -0.147054f,
        0.518360f,
        0.040043f,
        0.000000f,
        0.159963f,
        0.049291f,
        0.968487f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    //
    // Convert the white points of the two RGB spaces to XYZ
    //

    float fx = fileNeutral.x;
    float fy = fileNeutral.y;
    V3f   fileNeutralXYZ (fx / fy, 1, (1 - fx - fy) / fy);

    float ax = acesNeutral.x;
    float ay = acesNeutral.y;
    V3f   acesNeutralXYZ (ax / ay, 1, (1 - ax - ay) / ay);

    //
    // Compute the Bradford transformation matrix
    //

    V3f ratio ((acesNeutralXYZ * bradfordCPM) / (fileNeutralXYZ * bradfordCPM));

    M44f ratioMat (
        ratio[0], 0, 0, 0, 0, ratio[1], 0, 0, 0, 0, ratio[2], 0, 0, 0, 0, 1);

    M44f bradfordTrans = bradfordCPM * ratioMat * inverseBradfordCPM;

    //
    // Build a combined file-RGB-to-ACES-RGB conversion matrix
    //

    fileToAces = RGBtoXYZ (fileChr, 1) * bradfordTrans * XYZtoRGB (acesChr, 1);
}